

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_>::TPZFrontMatrix
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZRegisterClassId *this_00;
  TPZVec<int> *this_01;
  void **in_stack_ffffffffffffffb8;
  TPZAbstractFrontMatrix<float> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<float,TPZStackEqnStorage<float>,TPZFrontNonSym<float>>>
            (in_RDI,0x21);
  TPZAbstractFrontMatrix<float>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZFrontMatrix_025425d8;
  TPZStackEqnStorage<float>::TPZStackEqnStorage((TPZStackEqnStorage<float> *)(in_RDI + 0x20));
  this_00 = in_RDI + 0x15da8;
  TPZFrontNonSym<float>::TPZFrontNonSym((TPZFrontNonSym<float> *)this_00);
  this_01 = (TPZVec<int> *)(in_RDI + 0x15ee0);
  TPZVec<int>::TPZVec(this_01);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x15f00));
  TPZFrontNonSym<float>::Reset((TPZFrontNonSym<float> *)this_00,(int64_t)this_01);
  TPZStackEqnStorage<float>::Reset((TPZStackEqnStorage<float> *)0x1cd60b9);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined8 *)(in_RDI + 0x15ed8) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x15ed0) = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}